

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clRetainKernel(cl_kernel kernel)

{
  time_point tickEnd;
  bool bVar1;
  cl_uint cVar2;
  CLIntercept *this;
  cl_icd_dispatch *pcVar3;
  uint64_t enqueueCounter_00;
  SConfig *pSVar4;
  cl_kernel in_RDI;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_uint ref_count;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  cl_int in_stack_00000114;
  char *in_stack_00000118;
  CLIntercept *in_stack_00000120;
  cl_kernel in_stack_fffffffffffffef8;
  undefined4 uVar5;
  CLIntercept *in_stack_ffffffffffffff00;
  CLIntercept *in_stack_ffffffffffffff08;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  CLIntercept *in_stack_ffffffffffffff18;
  uint local_d8;
  int local_d4;
  CLIntercept *local_d0;
  CLIntercept *local_c8;
  allocator local_b9;
  string local_b8 [32];
  duration local_98;
  duration local_90;
  allocator local_71;
  uint64_t in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  CLIntercept *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  time_point in_stack_ffffffffffffffc0;
  time_point in_stack_ffffffffffffffc8;
  time_point in_stack_ffffffffffffffd0;
  uint local_4;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(this), pcVar3->clRetainKernel == (cl_api_clRetainKernel)0x0)) {
    local_d4 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_d4);
    local_4 = 0xffffffd0;
  }
  else {
    enqueueCounter_00 = CLIntercept::getEnqueueCounter(in_stack_ffffffffffffff08);
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->CallLogging & 1U) == 0) {
      local_d8 = 0;
    }
    else {
      local_d8 = CLIntercept::getRefCount(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->CallLogging & 1U) != 0) {
      in_stack_fffffffffffffef8 = in_RDI;
      CLIntercept::callLoggingEnter
                (this,"clRetainKernel",enqueueCounter_00,(cl_kernel)0x0,
                 "[ ref count = %d ] kernel = %p",(ulong)local_d8);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_ffffffffffffff00);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_ffffffffffffff00);
    pSVar4 = CLIntercept::config(this);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(this), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffc0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffd0.__d.__r = in_stack_ffffffffffffffc0.__d.__r;
    }
    pcVar3 = CLIntercept::dispatch(this);
    local_4 = (*pcVar3->clRetainKernel)(in_RDI);
    pSVar4 = CLIntercept::config(this);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(this), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffb0 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc8.__d.__r = (duration)(duration)in_stack_ffffffffffffffb0;
      pSVar4 = CLIntercept::config(this);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
         bVar1)) {
        in_stack_ffffffffffffff18 = this;
        std::allocator<char>::allocator();
        local_98 = in_stack_ffffffffffffffc8.__d.__r;
        local_90 = in_stack_ffffffffffffffd0.__d.__r;
        std::__cxx11::string::string((string *)&stack0xffffffffffffff90,"",&local_71);
        in_stack_ffffffffffffffc8.__d.__r = (duration)(duration)local_98.__r;
        in_stack_ffffffffffffffd0.__d.__r = (duration)(duration)local_90.__r;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffffc0.__d.__r,
                   (char *)CONCAT44(local_4,in_stack_ffffffffffffffb8),
                   (string *)in_stack_ffffffffffffffb0,(time_point)local_90.__r,
                   (time_point)local_98.__r);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
    }
    pSVar4 = CLIntercept::config(this);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(this), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(this), (pSVar4->NoErrors & 1U) != 0)) && (local_4 != 0)) {
      pSVar4 = CLIntercept::config(this);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000120,in_stack_00000118,in_stack_00000114);
      }
      pSVar4 = CLIntercept::config(this);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config(this);
      if ((pSVar4->NoErrors & 1U) != 0) {
        local_4 = 0;
      }
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(this);
      CObjectTracker::AddRetain<_cl_kernel*>
                ((CObjectTracker *)in_stack_ffffffffffffff18,
                 (_cl_kernel *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->CallLogging & 1U) == 0) {
      cVar2 = 0;
    }
    else {
      cVar2 = CLIntercept::getRefCount(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    uVar5 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (this,"clRetainKernel",(cl_int)(ulong)local_4,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"[ ref count = %d ]",CONCAT44(uVar5,cVar2));
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      paVar6 = &local_b9;
      std::allocator<char>::allocator();
      local_d0 = (CLIntercept *)in_stack_ffffffffffffffc8.__d.__r;
      local_c8 = (CLIntercept *)in_stack_ffffffffffffffd0.__d.__r;
      std::__cxx11::string::string(local_b8,"",paVar6);
      tickEnd.__d.__r._4_4_ = local_4;
      tickEnd.__d.__r._0_4_ = in_stack_ffffffffffffffb8;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (bool)in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90,in_stack_ffffffffffffffc0
                 ,tickEnd);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clRetainKernel)(
    cl_kernel kernel )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clRetainKernel )
    {
        GET_ENQUEUE_COUNTER();

        cl_uint ref_count =
            pIntercept->config().CallLogging ?
            pIntercept->getRefCount( kernel ) : 0;
        CALL_LOGGING_ENTER( "[ ref count = %d ] kernel = %p",
            ref_count,
            kernel );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clRetainKernel(
            kernel );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        ADD_OBJECT_RETAIN( kernel );
        ref_count =
            pIntercept->config().CallLogging ?
            pIntercept->getRefCount( kernel ) : 0;
        CALL_LOGGING_EXIT( retVal, "[ ref count = %d ]", ref_count );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_KERNEL);
}